

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void * tc_realloc(void *__ptr,size_t __size)

{
  bool bVar1;
  int iVar2;
  MallocBlock *this;
  MallocBlock *this_00;
  void *pvVar3;
  size_t sVar4;
  uintptr_t uVar5;
  SpinLock *local_68;
  SpinLockHolder local_40;
  SpinLockHolder l;
  size_t old_size;
  MallocBlock *p;
  MallocBlock *old;
  size_t size_local;
  void *ptr_local;
  
  if (__ptr == (void *)0x0) {
    ptr_local = do_debug_malloc_or_debug_cpp_alloc(__size);
    tcmalloc::InvokeNewHook(ptr_local,__size);
  }
  else if (__size == 0) {
    tcmalloc::InvokeDeleteHook(__ptr);
    DebugDeallocate(__ptr,-0x10325470,0);
    ptr_local = (void *)0x0;
  }
  else {
    bVar1 = tcmalloc::IsEmergencyPtr(__ptr);
    if (bVar1) {
      ptr_local = tcmalloc::EmergencyRealloc(__ptr,__size);
    }
    else {
      this = MallocBlock::FromRawPointer(__ptr);
      MallocBlock::Check(this,-0x10325470);
      this_00 = MallocBlock::Allocate(__size,-0x10325470);
      if (this_00 == (MallocBlock *)0x0) {
        ptr_local = (void *)0x0;
      }
      else {
        l.lock_ = (SpinLock *)MallocBlock::actual_data_size(this,__ptr);
        pvVar3 = MallocBlock::data_addr(this_00);
        local_68 = (SpinLock *)__size;
        if (l.lock_ < __size) {
          local_68 = l.lock_;
        }
        memcpy(pvVar3,__ptr,(size_t)local_68);
        tcmalloc::InvokeDeleteHook(__ptr);
        pvVar3 = MallocBlock::data_addr(this_00);
        tcmalloc::InvokeNewHook(pvVar3,__size);
        DebugDeallocate(__ptr,-0x10325470,0);
        if ((FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloctrace & 1) !=
            0) {
          SpinLockHolder::SpinLockHolder(&local_40,&malloc_trace_lock);
          iVar2 = TraceFd();
          pvVar3 = MallocBlock::data_addr(this_00);
          sVar4 = MallocBlock::actual_data_size(this_00,pvVar3);
          pvVar3 = MallocBlock::data_addr(this_00);
          uVar5 = tcmalloc::SelfThreadId();
          TracePrintf(iVar2,"%s\t%zu\t%p\t%zu","realloc",sVar4,pvVar3,uVar5);
          TraceStack();
          iVar2 = TraceFd();
          TracePrintf(iVar2,"\n");
          SpinLockHolder::~SpinLockHolder(&local_40);
        }
        ptr_local = MallocBlock::data_addr(this_00);
      }
    }
  }
  return ptr_local;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_realloc(void* ptr, size_t size) PERFTOOLS_NOTHROW {
  if (ptr == nullptr) {
    ptr = do_debug_malloc_or_debug_cpp_alloc(size);
    tcmalloc::InvokeNewHook(ptr, size);
    return ptr;
  }
  if (size == 0) {
    tcmalloc::InvokeDeleteHook(ptr);
    DebugDeallocate(ptr, MallocBlock::kMallocType, 0);
    return nullptr;
  }

  if (PREDICT_FALSE(tcmalloc::IsEmergencyPtr(ptr))) {
    return tcmalloc::EmergencyRealloc(ptr, size);
  }

  MallocBlock* old = MallocBlock::FromRawPointer(ptr);
  old->Check(MallocBlock::kMallocType);
  MallocBlock* p = MallocBlock::Allocate(size, MallocBlock::kMallocType);

  // If realloc fails we are to leave the old block untouched and
  // return null
  if (p == nullptr)  return nullptr;

  size_t old_size = old->actual_data_size(ptr);

  memcpy(p->data_addr(), ptr, (old_size < size) ? old_size : size);
  tcmalloc::InvokeDeleteHook(ptr);
  tcmalloc::InvokeNewHook(p->data_addr(), size);
  DebugDeallocate(ptr, MallocBlock::kMallocType, 0);
  MALLOC_TRACE("realloc", p->actual_data_size(p->data_addr()), p->data_addr());
  return p->data_addr();
}